

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poller.cpp
# Opt level: O1

int __thiscall hwnet::Poller::Add(Poller *this,Ptr *channel,int flag)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  int iVar3;
  int iVar4;
  undefined8 in_RAX;
  mapped_type *pmVar5;
  ulong uVar6;
  __node_base_ptr p_Var7;
  __node_base_ptr p_Var8;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  iVar3 = (*((channel->super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_Channel[1])();
  uVar1 = (this->channels)._M_h._M_bucket_count;
  uVar6 = (ulong)(long)iVar3 % uVar1;
  p_Var7 = (this->channels)._M_h._M_buckets[uVar6];
  p_Var8 = (__node_base_ptr)0x0;
  if ((p_Var7 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var7->_M_nxt, p_Var8 = p_Var7, iVar3 != *(int *)&p_Var7->_M_nxt[1]._M_nxt)) {
    while (p_Var7 = p_Var2, p_Var2 = p_Var7->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var8 = (__node_base_ptr)0x0;
      if (((ulong)(long)*(int *)&p_Var2[1]._M_nxt % uVar1 != uVar6) ||
         (p_Var8 = p_Var7, iVar3 == *(int *)&p_Var2[1]._M_nxt)) goto LAB_0011886a;
    }
    p_Var8 = (__node_base_ptr)0x0;
  }
LAB_0011886a:
  if (((p_Var8 == (__node_base_ptr)0x0) || (iVar3 = -1, p_Var8->_M_nxt == (_Hash_node_base *)0x0))
     && (iVar3 = Epoll::Add(&this->poller_,channel,flag), iVar3 == 0)) {
    iVar4 = (*((channel->super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              _vptr_Channel[1])();
    uStack_38 = CONCAT44(iVar4,(undefined4)uStack_38);
    pmVar5 = std::__detail::
             _Map_base<int,_std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->channels,(key_type *)((long)&uStack_38 + 4));
    (pmVar5->super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (channel->super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pmVar5->super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
               ,&(channel->super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return iVar3;
}

Assistant:

int Poller::Add(const Channel::Ptr &channel,int flag) {
	std::lock_guard<std::mutex> guard(this->mtx);
	if(this->channels.find(channel->Fd()) != this->channels.end()) {
		return -1;
	} else {
		int ret = poller_.Add(channel,flag);
		if(0 == ret) {
			this->channels[channel->Fd()] = channel;
		}
		return ret;
	}
}